

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O1

void __thiscall btSoftBody::CJoint::Solve(CJoint *this,btScalar dt,btScalar sor)

{
  Body *this_00;
  Body *this_01;
  btVector3 *rpos;
  undefined8 uVar1;
  float fVar2;
  Impulse *impulse;
  undefined1 auVar3 [16];
  float fVar4;
  float fVar5;
  float in_XMM1_Dc;
  float in_XMM1_Dd;
  float fVar6;
  undefined1 auVar7 [16];
  float fVar8;
  float fVar9;
  btVector3 bVar10;
  Impulse i;
  Impulse local_b8;
  undefined8 local_88;
  float local_78;
  float fStack_74;
  btScalar local_68;
  undefined1 local_58 [16];
  btVector3 local_48;
  undefined4 local_38;
  
  impulse = &local_b8;
  this_00 = (this->super_Joint).m_bodies;
  rpos = this->m_rpos;
  local_68 = sor;
  bVar10 = Body::velocity(this_00,rpos);
  local_88 = bVar10.m_floats._8_8_;
  this_01 = (this->super_Joint).m_bodies + 1;
  local_78 = in_XMM1_Dc;
  fStack_74 = in_XMM1_Dd;
  bVar10 = Body::velocity(this_01,this->m_rpos + 1);
  fVar9 = (float)local_88 - bVar10.m_floats[2];
  local_78 = local_78 - bVar10.m_floats[0];
  fStack_74 = fStack_74 - bVar10.m_floats[1];
  uVar1 = *(undefined8 *)(this->m_normal).m_floats;
  fVar4 = (float)uVar1;
  fVar5 = (float)((ulong)uVar1 >> 0x20);
  fVar6 = (this->m_normal).m_floats[2];
  fVar8 = fVar9 * fVar6 + local_78 * fVar4 + fVar5 * fStack_74;
  local_b8._32_1_ = (local_b8._32_1_ & 0xfc) + 1;
  local_b8.m_drift.m_floats[0] = 0.0;
  local_b8.m_drift.m_floats[1] = 0.0;
  local_b8.m_drift.m_floats[2] = 0.0;
  local_b8.m_drift.m_floats[3] = 0.0;
  local_b8.m_velocity.m_floats._0_8_ = *(undefined8 *)(this->super_Joint).m_drift.m_floats;
  local_b8.m_velocity.m_floats[2] =
       (btScalar)*(undefined8 *)((this->super_Joint).m_drift.m_floats + 2);
  if (fVar8 < 0.0) {
    fVar6 = fVar6 * fVar8;
    fVar4 = fVar4 * fVar8;
    fVar5 = fVar5 * fVar8;
    fVar8 = this->m_friction;
    fVar2 = local_b8.m_velocity.m_floats[1];
    local_b8.m_velocity.m_floats[0] =
         local_b8.m_velocity.m_floats[0] + fVar8 * (local_78 - fVar4) + fVar4;
    local_b8.m_velocity.m_floats[1] = fVar2 + fVar8 * (fStack_74 - fVar5) + fVar5;
    local_b8.m_velocity.m_floats[2] =
         (fVar9 - fVar6) * fVar8 + fVar6 + local_b8.m_velocity.m_floats[2];
  }
  fVar4 = ((this->super_Joint).m_massmatrix.m_el[2].m_floats[2] * local_b8.m_velocity.m_floats[2] +
          (this->super_Joint).m_massmatrix.m_el[2].m_floats[0] * local_b8.m_velocity.m_floats[0] +
          (this->super_Joint).m_massmatrix.m_el[2].m_floats[1] * local_b8.m_velocity.m_floats[1]) *
          local_68;
  fVar6 = local_68 *
          (local_b8.m_velocity.m_floats[2] * (this->super_Joint).m_massmatrix.m_el[0].m_floats[2] +
          local_b8.m_velocity.m_floats[0] * (this->super_Joint).m_massmatrix.m_el[0].m_floats[0] +
          (this->super_Joint).m_massmatrix.m_el[0].m_floats[1] * local_b8.m_velocity.m_floats[1]);
  fVar5 = local_68 *
          (local_b8.m_velocity.m_floats[2] * (this->super_Joint).m_massmatrix.m_el[1].m_floats[2] +
          local_b8.m_velocity.m_floats[0] * (this->super_Joint).m_massmatrix.m_el[1].m_floats[0] +
          (this->super_Joint).m_massmatrix.m_el[1].m_floats[1] * local_b8.m_velocity.m_floats[1]);
  local_b8.m_velocity.m_floats._0_8_ = CONCAT44(fVar5,fVar6);
  local_b8.m_velocity.m_floats._8_8_ = ZEXT48((uint)fVar4);
  if ((this->super_Joint).m_bodies[0].m_soft == (this->super_Joint).m_bodies[1].m_soft) {
    if (NAN(fVar6)) {
      return;
    }
    if (NAN(fVar5)) {
      return;
    }
    if (NAN(fVar4)) {
      return;
    }
    fVar6 = fVar4 * fVar4 + fVar6 * fVar6 + fVar5 * fVar5;
    if (fVar6 < 0.0) {
      fVar6 = sqrtf(fVar6);
    }
    else {
      fVar6 = SQRT(fVar6);
    }
    if (fVar6 < this_00->m_soft->m_maxSelfCollisionImpulse) {
      return;
    }
    auVar3._8_8_ = 0;
    auVar3._0_4_ = local_b8.m_velocity.m_floats[0];
    auVar3._4_4_ = local_b8.m_velocity.m_floats[1];
    auVar7._8_8_ = 0;
    auVar7._0_4_ = local_b8.m_drift.m_floats[0];
    auVar7._4_4_ = local_b8.m_drift.m_floats[1];
    fVar6 = this_00->m_soft->m_selfCollisionImpulseFactor;
    local_38 = local_b8._32_4_;
    local_58._4_4_ = SUB164(auVar3 ^ _DAT_001f5270,4) * fVar6;
    local_58._0_4_ = SUB164(auVar3 ^ _DAT_001f5270,0) * fVar6;
    local_58._8_4_ = (float)(local_b8.m_velocity.m_floats[2] ^ (uint)DAT_001f5270) * fVar6;
    local_58._12_4_ = 0;
    local_48.m_floats[1] = fVar6 * SUB164(auVar7 ^ _DAT_001f5270,4);
    local_48.m_floats[0] = fVar6 * SUB164(auVar7 ^ _DAT_001f5270,0);
    local_48.m_floats[2] = fVar6 * (float)((uint)local_b8.m_drift.m_floats[2] ^ (uint)DAT_001f5270);
    local_48.m_floats[3] = 0.0;
    Body::applyImpulse(this_00,(Impulse *)local_58,rpos);
    fVar6 = this_00->m_soft->m_selfCollisionImpulseFactor;
    local_38 = local_b8._32_4_;
    local_58._4_4_ = local_b8.m_velocity.m_floats[1] * fVar6;
    local_58._0_4_ = local_b8.m_velocity.m_floats[0] * fVar6;
    local_58._8_4_ = local_b8.m_velocity.m_floats[2];
    local_58._12_4_ = local_b8.m_velocity.m_floats[3];
    local_58._8_4_ = (float)local_58._8_4_ * fVar6;
    local_48.m_floats[1] = local_b8.m_drift.m_floats[1] * fVar6;
    local_48.m_floats[0] = local_b8.m_drift.m_floats[0] * fVar6;
    local_48.m_floats[2] = local_b8.m_drift.m_floats[2];
    local_48.m_floats[3] = local_b8.m_drift.m_floats[3];
    local_48.m_floats[2] = fVar6 * local_48.m_floats[2];
    impulse = (Impulse *)local_58;
  }
  else {
    local_38 = local_b8._32_4_;
    local_58._0_8_ = local_b8.m_velocity.m_floats._0_8_ ^ 0x8000000080000000;
    local_58._8_4_ = -fVar4;
    local_58._12_4_ = 0.0;
    local_48.m_floats[2] = -0.0;
    local_48.m_floats[0] = -0.0;
    local_48.m_floats[1] = -0.0;
    local_48.m_floats[3] = 0.0;
    Body::applyImpulse(this_00,(Impulse *)local_58,rpos);
  }
  Body::applyImpulse(this_01,impulse,this->m_rpos + 1);
  return;
}

Assistant:

void				btSoftBody::CJoint::Solve(btScalar dt,btScalar sor)
{
	const btVector3		va=m_bodies[0].velocity(m_rpos[0]);
	const btVector3		vb=m_bodies[1].velocity(m_rpos[1]);
	const btVector3		vrel=va-vb;
	const btScalar		rvac=btDot(vrel,m_normal);
	btSoftBody::Impulse	impulse;
	impulse.m_asVelocity	=	1;
	impulse.m_velocity		=	m_drift;
	if(rvac<0)
	{
		const btVector3	iv=m_normal*rvac;
		const btVector3	fv=vrel-iv;
		impulse.m_velocity	+=	iv+fv*m_friction;
	}
	impulse.m_velocity=m_massmatrix*impulse.m_velocity*sor;
	
	if (m_bodies[0].m_soft==m_bodies[1].m_soft)
	{
		if ((impulse.m_velocity.getX() ==impulse.m_velocity.getX())&&(impulse.m_velocity.getY() ==impulse.m_velocity.getY())&&
			(impulse.m_velocity.getZ() ==impulse.m_velocity.getZ()))
		{
			if (impulse.m_asVelocity)
			{
				if (impulse.m_velocity.length() <m_bodies[0].m_soft->m_maxSelfCollisionImpulse)
				{
					
				} else
				{
					m_bodies[0].applyImpulse(-impulse*m_bodies[0].m_soft->m_selfCollisionImpulseFactor,m_rpos[0]);
					m_bodies[1].applyImpulse( impulse*m_bodies[0].m_soft->m_selfCollisionImpulseFactor,m_rpos[1]);
				}
			}
		}
	} else
	{
		m_bodies[0].applyImpulse(-impulse,m_rpos[0]);
		m_bodies[1].applyImpulse( impulse,m_rpos[1]);
	}
}